

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::deliverMessage(CommonCore *this,ActionMessage *message)

{
  string_view name;
  bool bVar1;
  GlobalFederateId GVar2;
  route_id rVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  *this_00;
  pointer ppVar4;
  FederateState *pFVar5;
  ActionMessage *in_RSI;
  GlobalHandle in_RDI;
  BasicHandleInfo *in_stack_00000018;
  ActionMessage *in_stack_00000020;
  FilterFederate *in_stack_00000028;
  FederateState *fed;
  iterator kfnd;
  BasicHandleInfo *localP;
  ActionMessage *in_stack_000003e8;
  TranslatorFederate *in_stack_000003f0;
  ActionMessage *in_stack_ffffffffffffff58;
  FederateState *in_stack_ffffffffffffff60;
  ActionMessage *in_stack_ffffffffffffff68;
  HandleManager *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  GlobalFederateId in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CommonCore *in_stack_ffffffffffffff98;
  GlobalFederateId in_stack_ffffffffffffffa4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
  local_40;
  GlobalHandle local_38;
  __sv_type local_30;
  undefined4 local_1c;
  pair<helics::route_id,_helics::ActionMessage> *local_18;
  ActionMessage *local_10;
  
  local_10 = in_RSI;
  GVar2.gid = ActionMessage::action(in_RSI);
  if (((GVar2.gid == 0x2d6) || (GVar2.gid == 0x2da)) || (GVar2.gid != 0x10000014)) {
    rVar3 = getRoute((CommonCore *)in_RDI,GVar2);
    (**(code **)(*(long *)in_RDI + 0x358))(in_RDI,rVar3.rid,local_10);
  }
  else {
    local_1c = 0;
    bVar1 = GlobalFederateId::operator==(&local_10->dest_id,(GlobalBrokerId)0x0);
    if (bVar1) {
      in_stack_ffffffffffffff68 = (ActionMessage *)((long)in_RDI + 0x758);
      ActionMessage::getString_abi_cxx11_
                (in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      local_30 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff60);
      name._M_len._4_4_ = in_stack_ffffffffffffff8c;
      name._M_len._0_4_ = in_stack_ffffffffffffff88;
      name._M_str._0_4_ = in_stack_ffffffffffffff90.gid;
      name._M_str._4_4_ = in_stack_ffffffffffffff94;
      local_18 = (pair<helics::route_id,_helics::ActionMessage> *)
                 HandleManager::getInterfaceHandle
                           ((HandleManager *)CONCAT44(in_stack_ffffffffffffff84,GVar2.gid),name,
                            in_RDI.handle.hid._3_1_);
    }
    else {
      in_stack_ffffffffffffff60 = (FederateState *)((long)in_RDI + 0x758);
      local_38 = ActionMessage::getDest(in_stack_ffffffffffffff58);
      local_18 = (pair<helics::route_id,_helics::ActionMessage> *)
                 HandleManager::findHandle(in_stack_ffffffffffffff70,in_RDI);
    }
    if (local_18 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
      this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                 *)((long)in_RDI + 0x388);
      ActionMessage::getString_abi_cxx11_
                (in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
           ::find(this_00,(key_type *)0x473f4c);
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
           ::end(this_00);
      bVar1 = std::__detail::operator==(&local_40,&local_48);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        (**(code **)(*(long *)in_RDI + 0x358))(in_RDI,0,local_10);
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_false,_true>
                               *)0x473f88);
        (**(code **)(*(long *)in_RDI + 0x358))(in_RDI,(ppVar4->second).rid,local_10);
      }
    }
    else {
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                        (local_18,has_dest_filter_flag);
      if ((!bVar1) ||
         (bVar1 = FilterFederate::destinationProcessMessage
                            (in_stack_00000028,in_stack_00000020,in_stack_00000018), bVar1)) {
        bVar1 = GlobalFederateId::operator==(&local_10->dest_id,(GlobalBrokerId)0x0);
        if (bVar1) {
          GVar2 = BasicHandleInfo::getFederateId((BasicHandleInfo *)local_18);
          (local_10->dest_id).gid = GVar2.gid;
          in_stack_ffffffffffffffa4.gid =
               (BaseType)BasicHandleInfo::getInterfaceHandle((BasicHandleInfo *)local_18);
          (local_10->dest_handle).hid = in_stack_ffffffffffffffa4.gid;
        }
        BasicHandleInfo::getFederateId((BasicHandleInfo *)local_18);
        pFVar5 = getFederateCore(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa4);
        if (pFVar5 == (FederateState *)0x0) {
          BasicHandleInfo::getFederateId((BasicHandleInfo *)local_18);
          GVar2 = std::atomic::operator_cast_to_GlobalFederateId
                            ((atomic<helics::GlobalFederateId> *)in_stack_ffffffffffffff58);
          bVar1 = GlobalFederateId::operator==((GlobalFederateId *)&stack0xffffffffffffff90,GVar2);
          if ((bVar1) &&
             (*(TranslatorFederate **)((long)in_RDI + 0x948) != (TranslatorFederate *)0x0)) {
            TranslatorFederate::handleMessage(in_stack_000003f0,in_stack_000003e8);
          }
        }
        else {
          FederateState::addAction(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::deliverMessage(ActionMessage& message)
{
    switch (message.action()) {
        case CMD_SEND_MESSAGE: {
            // Find the destination endpoint
            auto* localP = (message.dest_id == parent_broker_id) ?
                loopHandles.getInterfaceHandle(message.getString(targetStringLoc),
                                               InterfaceType::ENDPOINT) :
                loopHandles.findHandle(message.getDest());
            if (localP == nullptr) {
                auto kfnd = knownExternalEndpoints.find(message.getString(targetStringLoc));
                if (kfnd != knownExternalEndpoints.end()) {  // destination is known
                    transmit(kfnd->second, message);
                } else {
                    transmit(parent_route_id, message);
                }
                return;
            }
            // now we deal with local processing
            if (checkActionFlag(*localP, has_dest_filter_flag)) {
                if (!filterFed->destinationProcessMessage(message, localP)) {
                    return;
                }
            }
            if (message.dest_id == parent_broker_id) {
                message.dest_id = localP->getFederateId();
                message.dest_handle = localP->getInterfaceHandle();
            }

            auto* fed = getFederateCore(localP->getFederateId());
            if (fed != nullptr) {
                fed->addAction(std::move(message));
            } else if (localP->getFederateId() == translatorFedID) {
                if (translatorFed != nullptr) {
                    translatorFed->handleMessage(message);
                }
            }
            // else we just drop it as that is a weird condition so ignore it
        } break;
        case CMD_SEND_FOR_FILTER:
        case CMD_SEND_FOR_FILTER_AND_RETURN:
        case CMD_SEND_FOR_DEST_FILTER_AND_RETURN:
        case CMD_FILTER_RESULT:
        case CMD_DEST_FILTER_RESULT:
        case CMD_NULL_MESSAGE:
        case CMD_NULL_DEST_MESSAGE:
        default: {
            transmit(getRoute(message.dest_id), message);
        } break;
    }
}